

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int local_64;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int t;
  int k;
  int dc;
  int diff;
  int b_local;
  stbi__int16 *fac_local;
  stbi__huffman *hac_local;
  stbi__huffman *hdc_local;
  short *data_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  iVar3 = stbi__jpeg_huff_decode(j,hdc);
  if (iVar3 < 0) {
    j_local._4_4_ = stbi__err("Corrupt JPEG");
  }
  else {
    memset(data,0,0x80);
    if (iVar3 == 0) {
      local_64 = 0;
    }
    else {
      local_64 = stbi__extend_receive(j,iVar3);
    }
    local_64 = j->img_comp[b].dc_pred + local_64;
    j->img_comp[b].dc_pred = local_64;
    *data = (short)local_64 * *dequant;
    zig = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      sVar2 = fac[(int)(j->code_buffer >> 0x17)];
      uVar4 = (uint)sVar2;
      if (uVar4 == 0) {
        uVar4 = stbi__jpeg_huff_decode(j,hac);
        if ((int)uVar4 < 0) {
          iVar3 = stbi__err("Corrupt JPEG");
          return iVar3;
        }
        if ((uVar4 & 0xf) == 0) {
          if (uVar4 != 0xf0) break;
          zig = zig + 0x10;
        }
        else {
          iVar3 = ((int)uVar4 >> 4) + zig;
          zig = iVar3 + 1;
          bVar1 = ""[iVar3];
          iVar3 = stbi__extend_receive(j,uVar4 & 0xf);
          data[(uint)bVar1] = (short)iVar3 * dequant[(uint)bVar1];
        }
      }
      else {
        iVar3 = ((int)uVar4 >> 4 & 0xfU) + zig;
        j->code_buffer = j->code_buffer << (sbyte)(uVar4 & 0xf);
        j->code_bits = j->code_bits - (uVar4 & 0xf);
        zig = iVar3 + 1;
        data[(uint)""[iVar3]] = (short)(char)((ushort)sVar2 >> 8) * dequant[(uint)""[iVar3]];
      }
    } while ((int)zig < 0x40);
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}